

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathDebugDumpObject(FILE *output,xmlXPathObjectPtr cur,int depth)

{
  ulong uVar1;
  double dVar2;
  xmlElementType xVar3;
  xmlNodePtr node;
  xmlNodeSetPtr pxVar4;
  _xmlNode *p_Var5;
  int iVar6;
  ulong uVar7;
  _xmlNode *node_00;
  char *pcVar8;
  long lVar9;
  size_t sStack_180;
  char local_178 [112];
  char local_108 [112];
  char shift [100];
  
  if (output == (FILE *)0x0) {
    return;
  }
  lVar9 = (long)depth;
  for (uVar7 = 0; ((long)uVar7 < lVar9 && (uVar7 < 0x19)); uVar7 = uVar7 + 1) {
    (shift + uVar7 * 2)[0] = ' ';
    (shift + uVar7 * 2)[1] = ' ';
  }
  (shift + uVar7 * 2)[0] = '\0';
  (shift + uVar7 * 2)[1] = '\0';
  fputs(shift,(FILE *)output);
  if (cur == (xmlXPathObjectPtr)0x0) {
    pcVar8 = "Object is empty (NULL)\n";
    goto LAB_001ae1e0;
  }
  switch(cur->type) {
  case XPATH_UNDEFINED:
    pcVar8 = "Object is uninitialized\n";
    sStack_180 = 0x18;
    goto LAB_001ae1e2;
  case XPATH_NODESET:
    fwrite("Object is a Node Set :\n",0x17,1,(FILE *)output);
    pxVar4 = cur->nodesetval;
    for (uVar7 = 0; ((long)uVar7 < lVar9 && (uVar7 < 0x19)); uVar7 = uVar7 + 1) {
      (local_178 + uVar7 * 2)[0] = ' ';
      (local_178 + uVar7 * 2)[1] = ' ';
    }
    (local_178 + uVar7 * 2)[0] = '\0';
    (local_178 + uVar7 * 2)[1] = '\0';
    if (pxVar4 != (xmlNodeSetPtr)0x0) {
      fprintf((FILE *)output,"Set contains %d nodes:\n",(ulong)(uint)pxVar4->nodeNr);
      iVar6 = depth + 1;
      uVar7 = 0;
LAB_001ae264:
      do {
        while( true ) {
          if ((long)pxVar4->nodeNr <= (long)uVar7) {
            return;
          }
          fputs(local_178,(FILE *)output);
          uVar1 = uVar7 + 1;
          fprintf((FILE *)output,"%d",uVar1 & 0xffffffff);
          node = pxVar4->nodeTab[uVar7];
          for (uVar7 = 0; ((long)uVar7 < (long)iVar6 && (uVar7 < 0x19)); uVar7 = uVar7 + 1) {
            (local_108 + uVar7 * 2)[0] = ' ';
            (local_108 + uVar7 * 2)[1] = ' ';
          }
          (local_108 + uVar7 * 2)[0] = '\0';
          (local_108 + uVar7 * 2)[1] = '\0';
          uVar7 = uVar1;
          if (node != (xmlNodePtr)0x0) break;
          fputs(local_108,(FILE *)output);
          pcVar8 = "Node is NULL !\n";
          sStack_180 = 0xf;
LAB_001ae301:
          fwrite(pcVar8,sStack_180,1,(FILE *)output);
        }
        xVar3 = node->type;
        if (xVar3 != XML_ATTRIBUTE_NODE) {
          if ((xVar3 == XML_HTML_DOCUMENT_NODE) || (xVar3 == XML_DOCUMENT_NODE)) {
            fputs(local_108,(FILE *)output);
            pcVar8 = " /\n";
            sStack_180 = 3;
            goto LAB_001ae301;
          }
          xmlDebugDumpOneNode(output,node,iVar6);
          goto LAB_001ae264;
        }
        xmlDebugDumpAttr(output,(xmlAttrPtr)node,iVar6);
      } while( true );
    }
    fputs(local_178,(FILE *)output);
    pcVar8 = "NodeSet is NULL !\n";
    sStack_180 = 0x12;
    break;
  case XPATH_BOOLEAN:
    fwrite("Object is a Boolean : ",0x16,1,(FILE *)output);
    if (cur->boolval == 0) {
      pcVar8 = "false\n";
      sStack_180 = 6;
    }
    else {
      pcVar8 = "true\n";
      sStack_180 = 5;
    }
    goto LAB_001ae1e2;
  case XPATH_NUMBER:
    dVar2 = cur->floatval;
    iVar6 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
    if (ABS(dVar2) != INFINITY) {
      iVar6 = 0;
    }
    if (iVar6 == -1) {
      pcVar8 = "Object is a number : -Infinity\n";
      sStack_180 = 0x1f;
      goto LAB_001ae1e2;
    }
    if (iVar6 == 1) {
      pcVar8 = "Object is a number : Infinity\n";
      sStack_180 = 0x1e;
      goto LAB_001ae1e2;
    }
    if (NAN(dVar2)) {
      pcVar8 = "Object is a number : NaN\n";
      sStack_180 = 0x19;
      goto LAB_001ae1e2;
    }
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      fprintf((FILE *)output,"Object is a number : %0g\n");
      return;
    }
    pcVar8 = "Object is a number : 0\n";
    goto LAB_001ae1e0;
  case XPATH_STRING:
    fwrite("Object is a string : ",0x15,1,(FILE *)output);
    xmlDebugDumpString(output,cur->stringval);
    fputc(10,(FILE *)output);
    return;
  default:
    goto switchD_001ae1cc_caseD_5;
  case XPATH_USERS:
    pcVar8 = "Object is user defined\n";
LAB_001ae1e0:
    sStack_180 = 0x17;
LAB_001ae1e2:
    fwrite(pcVar8,sStack_180,1,(FILE *)output);
    return;
  case XPATH_XSLT_TREE:
    fwrite("Object is an XSLT value tree :\n",0x1f,1,(FILE *)output);
    pxVar4 = cur->nodesetval;
    for (uVar7 = 0; ((long)uVar7 < lVar9 && (uVar7 < 0x19)); uVar7 = uVar7 + 1) {
      (local_178 + uVar7 * 2)[0] = ' ';
      (local_178 + uVar7 * 2)[1] = ' ';
    }
    (local_178 + uVar7 * 2)[0] = '\0';
    (local_178 + uVar7 * 2)[1] = '\0';
    if (((pxVar4 == (xmlNodeSetPtr)0x0) || (pxVar4->nodeNr == 0)) ||
       (*pxVar4->nodeTab == (xmlNodePtr)0x0)) {
      fputs(local_178,(FILE *)output);
      pcVar8 = "Value Tree is NULL !\n";
      sStack_180 = 0x15;
    }
    else {
      fputs(local_178,(FILE *)output);
      fprintf((FILE *)output,"%d",(ulong)((int)uVar7 + 1));
      node_00 = (*pxVar4->nodeTab)->children;
      for (uVar7 = 0; ((long)uVar7 < (long)(depth + 1) && (uVar7 < 0x19)); uVar7 = uVar7 + 1) {
        (local_108 + uVar7 * 2)[0] = ' ';
        (local_108 + uVar7 * 2)[1] = ' ';
      }
      (local_108 + uVar7 * 2)[0] = '\0';
      (local_108 + uVar7 * 2)[1] = '\0';
      if (node_00 != (_xmlNode *)0x0) {
        while (node_00 != (xmlNodePtr)0x0) {
          p_Var5 = node_00->next;
          xmlDebugDumpOneNode(output,node_00,depth + 1);
          node_00 = p_Var5;
        }
        return;
      }
      fputs(local_108,(FILE *)output);
      pcVar8 = "Node is NULL !\n";
      sStack_180 = 0xf;
    }
  }
  fwrite(pcVar8,sStack_180,1,(FILE *)output);
switchD_001ae1cc_caseD_5:
  return;
}

Assistant:

void
xmlXPathDebugDumpObject(FILE *output, xmlXPathObjectPtr cur, int depth) {
    int i;
    char shift[100];

    if (output == NULL) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;


    fprintf(output, "%s", shift);

    if (cur == NULL) {
        fprintf(output, "Object is empty (NULL)\n");
	return;
    }
    switch(cur->type) {
        case XPATH_UNDEFINED:
	    fprintf(output, "Object is uninitialized\n");
	    break;
        case XPATH_NODESET:
	    fprintf(output, "Object is a Node Set :\n");
	    xmlXPathDebugDumpNodeSet(output, cur->nodesetval, depth);
	    break;
	case XPATH_XSLT_TREE:
	    fprintf(output, "Object is an XSLT value tree :\n");
	    xmlXPathDebugDumpValueTree(output, cur->nodesetval, depth);
	    break;
        case XPATH_BOOLEAN:
	    fprintf(output, "Object is a Boolean : ");
	    if (cur->boolval) fprintf(output, "true\n");
	    else fprintf(output, "false\n");
	    break;
        case XPATH_NUMBER:
	    switch (xmlXPathIsInf(cur->floatval)) {
	    case 1:
		fprintf(output, "Object is a number : Infinity\n");
		break;
	    case -1:
		fprintf(output, "Object is a number : -Infinity\n");
		break;
	    default:
		if (xmlXPathIsNaN(cur->floatval)) {
		    fprintf(output, "Object is a number : NaN\n");
		} else if (cur->floatval == 0) {
                    /* Omit sign for negative zero. */
		    fprintf(output, "Object is a number : 0\n");
		} else {
		    fprintf(output, "Object is a number : %0g\n", cur->floatval);
		}
	    }
	    break;
        case XPATH_STRING:
	    fprintf(output, "Object is a string : ");
	    xmlDebugDumpString(output, cur->stringval);
	    fprintf(output, "\n");
	    break;
	case XPATH_USERS:
	    fprintf(output, "Object is user defined\n");
	    break;
    }
}